

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  pointer pIVar5;
  int *piVar6;
  IdxElement *keys;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  uint uVar15;
  DataKey DVar16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  long lVar17;
  cpp_dec_float<100U,_int,_void> local_248;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  *local_1e8;
  pointer local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_17c [12];
  uint auStack_170 [2];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 0x10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems[6] = 0;
  local_248.data._M_elems[7] = 0;
  local_248.data._M_elems[8] = 0;
  local_248.data._M_elems[9] = 0;
  local_248.data._M_elems[10] = 0;
  local_248.data._M_elems[0xb] = 0;
  local_248.data._M_elems[0xc] = 0;
  local_248.data._M_elems[0xd] = 0;
  local_248.data._M_elems._56_5_ = 0;
  local_248.data._M_elems[0xf]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (pSVar3->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x10;
  stack0xfffffffffffffe88 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_148[0] = 0;
  local_148[1] = 0;
  stack0xfffffffffffffec0 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  pIVar5 = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pricesCo).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
    (this->pricesCo).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
  }
  (this->bestPricesCo).super_IdxSet.num = 0;
  lVar17 = (long)(pSVar3->infeasibilitiesCo).super_IdxSet.num;
  local_1f0 = best;
  if (0 < lVar17) {
    local_1e8 = &this->pricesCo;
    lVar17 = lVar17 + 1;
    do {
      iVar2 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[lVar17 + -2];
      local_248.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
      local_248.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
      local_248.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_248.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x20);
      local_248.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_248.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x30);
      local_248.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_248.data._M_elems._56_5_ = SUB85(uVar7,0);
      local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_248.exp = pnVar4[iVar2].m_backend.exp;
      local_248.neg = pnVar4[iVar2].m_backend.neg;
      local_248.fpclass = pnVar4[iVar2].m_backend.fpclass;
      local_248.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2)
      ;
      result.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      result.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      result.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      if ((result.m_backend.fpclass == cpp_dec_float_NaN || local_248.fpclass == cpp_dec_float_NaN)
         || (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_248,&result.m_backend), -1 < iVar14)) {
        pSVar3 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar6 = (pSVar3->infeasibilitiesCo).super_IdxSet.idx;
        iVar14 = (pSVar3->infeasibilitiesCo).super_IdxSet.num;
        (pSVar3->infeasibilitiesCo).super_IdxSet.num = iVar14 + -1;
        piVar6[lVar17 + -2] = piVar6[(long)iVar14 + -1];
        (pSVar3->isInfeasibleCo).data[iVar2] = 0;
      }
      else {
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar2] = 1;
        uStack_50 = CONCAT35(local_248.data._M_elems[0xf]._1_3_,local_248.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_248.data._M_elems._0_8_;
        auStack_80[0] = local_248.data._M_elems[2];
        auStack_80[1] = local_248.data._M_elems[3];
        local_78[0] = local_248.data._M_elems[4];
        local_78[1] = local_248.data._M_elems[5];
        auStack_70[0] = local_248.data._M_elems[6];
        auStack_70[1] = local_248.data._M_elems[7];
        local_68[0] = local_248.data._M_elems[8];
        local_68[1] = local_248.data._M_elems[9];
        auStack_60[0] = local_248.data._M_elems[10];
        auStack_60[1] = local_248.data._M_elems[0xb];
        local_58[0] = local_248.data._M_elems[0xc];
        local_58[1] = local_248.data._M_elems[0xd];
        local_48 = local_248.exp;
        local_44 = local_248.neg;
        local_40 = local_248.fpclass;
        iStack_3c = local_248.prec_elem;
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_1e0[iVar2].m_backend.data;
        local_d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_1e0[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = local_1e0[iVar2].m_backend.exp;
        local_d8.m_backend.neg = local_1e0[iVar2].m_backend.neg;
        local_d8.m_backend.fpclass = local_1e0[iVar2].m_backend.fpclass;
        local_d8.m_backend.prec_elem = local_1e0[iVar2].m_backend.prec_elem;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        local_17c._0_4_ = iVar2;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_88,&local_d8,&local_128,in_R8);
        local_148[0] = result.m_backend.data._M_elems[0xc];
        local_148[1] = result.m_backend.data._M_elems[0xd];
        stack0xfffffffffffffec0 = result.m_backend.data._M_elems._56_5_;
        uStack_13b = result.m_backend.data._M_elems[0xf]._1_3_;
        local_158._8_4_ = result.m_backend.data._M_elems[10];
        local_158._12_4_ = result.m_backend.data._M_elems[0xb];
        local_158._0_4_ = result.m_backend.data._M_elems[8];
        local_158._4_4_ = result.m_backend.data._M_elems[9];
        local_168._8_4_ = result.m_backend.data._M_elems[6];
        local_168._12_4_ = result.m_backend.data._M_elems[7];
        local_168._0_4_ = result.m_backend.data._M_elems[4];
        local_168._4_4_ = result.m_backend.data._M_elems[5];
        auStack_170[0] = result.m_backend.data._M_elems[2];
        auStack_170[1] = result.m_backend.data._M_elems[3];
        local_17c._4_4_ = result.m_backend.data._M_elems[0];
        local_17c._8_4_ = result.m_backend.data._M_elems[1];
        iStack_138 = result.m_backend.exp;
        bStack_134 = result.m_backend.neg;
        local_130._0_4_ = result.m_backend.fpclass;
        local_130._4_4_ = result.m_backend.prec_elem;
        std::
        vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
        ::push_back(&local_1e8->data,(value_type *)local_17c);
      }
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  keys = (this->pricesCo).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  uVar15 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,&(this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).compare,0,(int)((ulong)((long)pIVar5 - (long)keys) >> 2) * 0x3cf3cf3d,
                      100,0,0,true);
  if (0 < (int)uVar15) {
    lVar17 = 0;
    do {
      DIdxSet::addIdx(&this->bestPricesCo,
                      *(int *)((long)&(((this->pricesCo).data.
                                        super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                              lVar17 + -4));
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasibleCo).data
      [*(int *)((long)&(((this->pricesCo).data.
                         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar17 + -4)]
           = 2;
      lVar17 = lVar17 + 0x54;
    } while ((ulong)uVar15 * 0x54 - lVar17 != 0);
  }
  if ((int)uVar15 < 1) {
    DVar16.info = 0;
    DVar16.idx = -1;
  }
  else {
    pIVar5 = (this->pricesCo).data.
             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = *(undefined8 *)&(pIVar5->val).m_backend.data;
    uVar8 = *(undefined8 *)((long)&(pIVar5->val).m_backend + 8);
    uVar9 = *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x10);
    uVar10 = *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x18);
    uVar11 = *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x20);
    uVar12 = *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x28);
    uVar13 = *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x38);
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x30);
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 0xe) = uVar13;
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 8) = uVar11;
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 10) = uVar12;
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(local_1f0->m_backend).data._M_elems = uVar7;
    *(undefined8 *)((local_1f0->m_backend).data._M_elems + 2) = uVar8;
    (local_1f0->m_backend).exp = *(int *)((long)&(pIVar5->val).m_backend + 0x40);
    (local_1f0->m_backend).neg = *(bool *)((long)&(pIVar5->val).m_backend + 0x44);
    *(undefined8 *)&(local_1f0->m_backend).fpclass =
         *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x48);
    DVar16 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,
                           ((this->pricesCo).data.
                            super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                            ._M_impl.super__Vector_impl_data._M_start)->idx);
  }
  return (SPxId)DVar16;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterCoDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   pricesCo.clear();
   bestPricesCo.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasibleCo[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, pen[idx], feastol);
         pricesCo.append(price);
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < pricesCo.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(pricesCo[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(pricesCo[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = pricesCo.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(pricesCo.get_ptr(), this->compare, 0, pricesCo.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPricesCo.addIdx(pricesCo[i].idx);
      this->thesolver->isInfeasibleCo[pricesCo[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = pricesCo[0].val;
      return this->thesolver->id(pricesCo[0].idx);
   }
   else
      return SPxId();
}